

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGI.cpp
# Opt level: O2

bool __thiscall CGI::check_first_line(CGI *this,CharContent *first_line,Response *response)

{
  size_t sVar1;
  pointer this_00;
  size_t sVar2;
  bool bVar3;
  vector<CharContent,_std::allocator<CharContent>_> string_list;
  CharContent local_60;
  vector<CharContent,_std::allocator<CharContent>_> local_38;
  
  string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CharContent::CharContent(&local_60," ");
  CharContent::split(&local_38,first_line,&local_60);
  std::vector<CharContent,_std::allocator<CharContent>_>::_M_move_assign(&string_list,&local_38);
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&local_38);
  CharContent::~CharContent(&local_60);
  this_00 = string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (2 < (ulong)(((long)string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x28)) {
    CharContent::CharContent(&local_60,"HTTP");
    sVar2 = CharContent::find(this_00,&local_60,0);
    sVar1 = (string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
             super__Vector_impl_data._M_start)->npos;
    CharContent::~CharContent(&local_60);
    if (sVar2 != sVar1) {
      CharContent::operator=
                (&response->protocol,
                 string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                 super__Vector_impl_data._M_start);
      bVar3 = true;
      CharContent::operator=
                (&response->code,
                 string_list.super__Vector_base<CharContent,_std::allocator<CharContent>_>._M_impl.
                 super__Vector_impl_data._M_start + 1);
      goto LAB_0010b913;
    }
  }
  bVar3 = false;
LAB_0010b913:
  std::vector<CharContent,_std::allocator<CharContent>_>::~vector(&string_list);
  return bVar3;
}

Assistant:

bool CGI::check_first_line(CharContent first_line,Response *response){
	std::vector<CharContent> string_list;
	string_list=first_line.split(" ");
	if(string_list.size()<3)
		return false;
	if(string_list[0].find("HTTP")==string_list[0].npos)
		return false;
	response->protocol=string_list[0];
	response->code=string_list[1];
	return true;
}